

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

TCGv_i32 gen_addr_index(DisasContext_conflict2 *s,uint16_t ext,TCGv_i32 tmp)

{
  TCGContext_conflict2 *tcg_ctx;
  TCGv_i32 arg1;
  uint uVar1;
  undefined6 in_register_00000032;
  ulong uVar2;
  TCGv_i32 *ppTVar3;
  
  uVar2 = CONCAT62(in_register_00000032,ext);
  tcg_ctx = s->uc->tcg_ctx;
  if ((short)ext < 0) {
    uVar1 = (uint)(uVar2 >> 0xc) & 7;
    ppTVar3 = s->writeback;
    if (((uint)s->writeback_mask >> uVar1 & 1) == 0) {
      ppTVar3 = tcg_ctx->cpu_aregs;
    }
  }
  else {
    uVar1 = (uint)(uVar2 >> 0xc) & 0xfffff;
    ppTVar3 = tcg_ctx->cpu_dregs;
  }
  arg1 = ppTVar3[uVar1];
  if (((uint)uVar2 >> 0xb & 1) == 0) {
    tcg_gen_ext16s_i32_m68k(tcg_ctx,tmp,ppTVar3[uVar1]);
    arg1 = tmp;
  }
  uVar1 = (uint)uVar2 >> 9 & 3;
  if (uVar1 != 0) {
    tcg_gen_shli_i32_m68k(tcg_ctx,tmp,arg1,uVar1);
    arg1 = tmp;
  }
  return arg1;
}

Assistant:

static TCGv gen_addr_index(DisasContext *s, uint16_t ext, TCGv tmp)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TCGv add;
    int scale;

    add = (ext & 0x8000) ? AREG(ext, 12) : DREG(ext, 12);
    if ((ext & 0x800) == 0) {
        tcg_gen_ext16s_i32(tcg_ctx, tmp, add);
        add = tmp;
    }
    scale = (ext >> 9) & 3;
    if (scale != 0) {
        tcg_gen_shli_i32(tcg_ctx, tmp, add, scale);
        add = tmp;
    }
    return add;
}